

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O0

void soul::FunctionBuilder::populateFunctionBody
               (Module *m,Function *fn,function<void_(soul::FunctionBuilder_&)> *buildFunction)

{
  bool local_5d [8];
  bool terminationOK;
  undefined1 local_50 [8];
  FunctionBuilder builder;
  function<void_(soul::FunctionBuilder_&)> *buildFunction_local;
  Function *fn_local;
  Module *m_local;
  
  builder._40_8_ = buildFunction;
  checkAssertion((bool)(fn->hasNoBody & 1),"fn.hasNoBody","populateFunctionBody",0x172);
  fn->hasNoBody = false;
  FunctionBuilder((FunctionBuilder *)local_50,m);
  beginFunction((FunctionBuilder *)local_50,fn);
  std::function<void_(soul::FunctionBuilder_&)>::operator()
            (buildFunction,(FunctionBuilder *)local_50);
  endFunction((FunctionBuilder *)local_50);
  if ((fn->hasNoBody & 1U) == 0) {
    local_5d[0] = checkFunctionBlocksForTermination((FunctionBuilder *)local_50);
    checkAssertion(local_5d[0],"terminationOK","populateFunctionBody",0x17e);
    ignoreUnused<bool&>(local_5d);
  }
  ~FunctionBuilder((FunctionBuilder *)local_50);
  return;
}

Assistant:

static void populateFunctionBody (Module& m, heart::Function& fn, std::function<void(FunctionBuilder&)> buildFunction)
    {
        SOUL_ASSERT (fn.hasNoBody);

        fn.hasNoBody = false;

        FunctionBuilder builder (m);
        builder.beginFunction (fn);
        buildFunction (builder);
        builder.endFunction();

        if (! fn.hasNoBody)
        {
            bool terminationOK = builder.checkFunctionBlocksForTermination();
            SOUL_ASSERT (terminationOK); ignoreUnused (terminationOK);
        }
    }